

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O0

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>::KsiBar
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_> *this,TPZVec<double> *ksi,
          TPZVec<double> *ksibar,TPZFMatrix<double> *jac)

{
  long *in_RCX;
  TPZVec<double> *in_RDX;
  int64_t in_RDI;
  double dVar1;
  double dVar2;
  int jd;
  int id;
  int in;
  TPZFNMatrix<2,_double> dphi;
  TPZFNMatrix<2,_double> phi;
  int dim;
  TPZFMatrix<double> *in_stack_fffffffffffffdf8;
  TPZVec<double> *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  TPZFMatrix<double> *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  int64_t in_stack_fffffffffffffe30;
  TPZFNMatrix<2,_double> *this_00;
  double *pdVar3;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int iVar4;
  undefined4 local_1a8;
  undefined4 local_1a4;
  
  pdVar3 = (double *)0x2;
  this_00 = (TPZFNMatrix<2,_double> *)0x1;
  TPZFNMatrix<2,_double>::TPZFNMatrix
            ((TPZFNMatrix<2,_double> *)0x1,in_RDI,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  TPZFNMatrix<2,_double>::TPZFNMatrix
            (this_00,in_RDI,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  pztopology::TPZLine::Shape
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(TPZFMatrix<double> *)0x1b20afe);
  (**(code **)(*in_RCX + 0x70))(in_RCX,1);
  TPZVec<double>::Fill
            ((TPZVec<double> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),pdVar3,
             (int64_t)this_00,in_RDI);
  for (local_1a4 = 0; local_1a4 < 2; local_1a4 = local_1a4 + 1) {
    for (local_1a8 = 0; local_1a8 < 1; local_1a8 = local_1a8 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18,
                          (int64_t)in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe20 = (TPZFMatrix<double> *)*pdVar3;
      dVar1 = TPZFMatrix<double>::GetVal
                        ((TPZFMatrix<double> *)(in_RDI + 200),(long)local_1a8,(long)local_1a4);
      in_stack_fffffffffffffe18 = TPZVec<double>::operator[](in_RDX,(long)local_1a8);
      *in_stack_fffffffffffffe18 =
           (double)in_stack_fffffffffffffe20 * dVar1 + *in_stack_fffffffffffffe18;
      for (iVar4 = 0; iVar4 < 1; iVar4 = iVar4 + 1) {
        in_stack_fffffffffffffe10 =
             TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18,
                        (int64_t)in_stack_fffffffffffffe10);
        dVar1 = *in_stack_fffffffffffffe10;
        dVar2 = TPZFMatrix<double>::GetVal
                          ((TPZFMatrix<double> *)(in_RDI + 200),(long)local_1a8,(long)local_1a4);
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18,
                            (int64_t)in_stack_fffffffffffffe10);
        *pdVar3 = dVar1 * dVar2 + *pdVar3;
      }
    }
  }
  TPZFNMatrix<2,_double>::~TPZFNMatrix((TPZFNMatrix<2,_double> *)0x1b20d00);
  TPZFNMatrix<2,_double>::~TPZFNMatrix((TPZFNMatrix<2,_double> *)0x1b20d0d);
  return;
}

Assistant:

void KsiBar(TPZVec<REAL> &ksi, TPZVec<REAL> &ksibar, TPZFMatrix<REAL> &jac) const
    {
		const int dim = Geo::Dimension;
		TPZFNMatrix<Geo::NNodes> phi(Geo::NNodes,1,0.);
		TPZFNMatrix<dim*Geo::NNodes> dphi(dim,Geo::NNodes,0.);
		Geo::Shape(ksi,phi,dphi);
		jac.Redim(dim,dim);
		ksibar.Fill(0.);
		int in,id,jd;
		for(in=0; in<Geo::NNodes; in++)
		{
			for(id=0; id<dim; id++)
			{
				ksibar[id] += phi(in,0)*fCornerCo.GetVal(id,in);
				for(jd=0; jd<dim; jd++)
				{
					jac(id,jd) += dphi(jd,in)*fCornerCo.GetVal(id,in);
				}
			}
		}
    }